

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

var * __thiscall cs::domain_manager::get_var(domain_manager *this,var_id *id)

{
  stack_pointer psVar1;
  bool bVar2;
  ulong uVar3;
  var *pvVar4;
  runtime_error *this_00;
  ulong uVar5;
  domain_type *pdVar6;
  size_t i;
  size_t domain_id;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar1 = *this->fiber_stack;
  uVar5 = id->m_domain_id;
  if (psVar1 != (stack_pointer)0x0) {
    pdVar6 = psVar1->m_current;
    uVar3 = ((long)pdVar6 - (long)psVar1->m_start) / 0x60;
    if ((uVar5 < uVar3) &&
       ((id->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        pdVar6[-1 - uVar5].m_ref.super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)) goto LAB_0015da09;
    lVar7 = -0x60;
    for (domain_id = 0; uVar3 != domain_id; domain_id = domain_id + 1) {
      bVar2 = domain_type::exist((domain_type *)
                                 ((long)&((*this->fiber_stack)->m_current->m_reflect).
                                         super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                         .
                                         super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                         .ctrl_ + lVar7),id);
      if (bVar2) {
        pdVar6 = (domain_type *)
                 ((long)&((*this->fiber_stack)->m_current->m_reflect).
                         super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         .
                         super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         .ctrl_ + lVar7);
        goto LAB_0015d9ed;
      }
      lVar7 = lVar7 + -0x60;
    }
    uVar5 = id->m_domain_id;
  }
  pdVar6 = (this->m_data).m_current;
  uVar3 = ((long)pdVar6 - (long)(this->m_data).m_start) / 0x60;
  if ((uVar3 <= uVar5) ||
     ((id->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      pdVar6[-1 - uVar5].m_ref.super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )) {
    lVar7 = -0x60;
    domain_id = 0;
    while( true ) {
      if (uVar3 == domain_id) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::operator+(&local_70,"Use of undefined variable \"",&id->m_id);
        std::operator+(&local_50,&local_70,"\".");
        runtime_error::runtime_error(this_00,&local_50);
        __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
      bVar2 = domain_type::exist((domain_type *)
                                 ((long)&(((this->m_data).m_current)->m_reflect).
                                         super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                         .
                                         super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                         .ctrl_ + lVar7),id);
      if (bVar2) break;
      domain_id = domain_id + 1;
      lVar7 = lVar7 + -0x60;
    }
    pdVar6 = (domain_type *)
             ((long)&(((this->m_data).m_current)->m_reflect).
                     super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     .
                     super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     .ctrl_ + lVar7);
LAB_0015d9ed:
    pvVar4 = domain_type::get_var_no_check(pdVar6,id,domain_id);
    return pvVar4;
  }
LAB_0015da09:
  return pdVar6[-1 - uVar5].m_slot.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
         _M_impl.super__Vector_impl_data._M_start + id->m_slot_id;
}

Assistant:

inline var &get_var(const var_id &id)
		{
			if (fiber_stack != nullptr) {
				if (id.m_domain_id < fiber_stack->size() && (*fiber_stack)[id.m_domain_id].consistence(id))
					return (*fiber_stack)[id.m_domain_id].get_var_by_id(id.m_slot_id);
				for (std::size_t i = 0, size = fiber_stack->size(); i < size; ++i)
					if ((*fiber_stack)[i].exist(id))
						return (*fiber_stack)[i].get_var_no_check(id, i);
			}
			if (id.m_domain_id < m_data.size() && m_data[id.m_domain_id].consistence(id))
				return m_data[id.m_domain_id].get_var_by_id(id.m_slot_id);
			for (std::size_t i = 0, size = m_data.size(); i < size; ++i)
				if (m_data[i].exist(id))
					return m_data[i].get_var_no_check(id, i);
			throw runtime_error("Use of undefined variable \"" + id.get_id() + "\".");
		}